

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_pack4.h
# Opt level: O0

void ncnn::deconvolution_pack4_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *weight_data_packed,Mat *bias_data,int kernel_w,
               int kernel_h,int dilation_w,int dilation_h,int stride_w,int stride_h,
               int activation_type,Mat *activation_params,Option *opt)

{
  float *pfVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  long lVar71;
  long lVar72;
  long lVar73;
  long lVar74;
  int iVar75;
  int iVar76;
  undefined8 *puVar77;
  long lVar78;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  undefined1 auVar83 [16];
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  undefined4 in_stack_00000028;
  long *in_stack_00000030;
  __m128 _w3;
  __m128 _w2;
  __m128 _w1;
  __m128 _w0;
  __m128 _val3;
  __m128 _val2;
  __m128 _val1;
  __m128 _val0;
  int k;
  float *sptr;
  int sx;
  int sxs;
  int x;
  int sy;
  int sys;
  int y;
  Mat m_2;
  int q;
  float *kptr;
  __m128 _sum;
  int j;
  int i;
  int outh;
  int outw;
  int channels;
  int h;
  int w;
  int maxk;
  float *outptr;
  int p;
  float *bias_data_ptr;
  int kernel_extent_h;
  int kernel_extent_w;
  int outch;
  Mat *m;
  Mat *m_3;
  Mat *m_1;
  __m128 _b;
  __m128 _a;
  __m128 max;
  __m128 min;
  __m128 neg;
  __m128 pos;
  __m128 one;
  __m128 one_7;
  v4sf pow2n_1;
  v4sf y_2;
  v4sf mask_1;
  v4sf one_2;
  v4si emm0_1;
  v4sf fx_1;
  v4sf tmp_1;
  v4sf pow2n;
  v4sf y_1;
  v4sf mask;
  v4sf one_1;
  v4si emm0;
  v4sf fx;
  v4sf tmp;
  __m128 two;
  __m128 one_4;
  __m128 one_5;
  v4sf pow2n_2;
  v4sf y_4;
  v4sf mask_3;
  v4sf one_6;
  v4si emm0_3;
  v4sf fx_2;
  v4sf tmp_3;
  v4sf y_3;
  v4sf z;
  v4sf tmp_2;
  v4sf mask_2;
  v4sf e;
  v4sf invalid_mask;
  v4sf one_3;
  v4si emm0_2;
  int local_23c8;
  int local_23bc;
  int local_236c;
  long local_2320;
  undefined8 local_2318;
  undefined8 uStack_2310;
  int local_2304;
  int local_2300;
  undefined8 *local_2290;
  int local_2284;
  float local_1ea8;
  float fStack_1ea4;
  float fStack_1ea0;
  float fStack_1e9c;
  undefined1 local_1e28 [8];
  undefined8 uStack_1e20;
  ulong uStack_1e10;
  float local_1db8;
  float fStack_1db4;
  float fStack_1db0;
  float fStack_1dac;
  float local_1d98;
  float fStack_1d94;
  float fStack_1d90;
  float fStack_1d8c;
  float local_1d78;
  float fStack_1d74;
  float fStack_1d70;
  float fStack_1d6c;
  float local_1d58;
  float fStack_1d54;
  float fStack_1d50;
  float fStack_1d4c;
  float local_1c88;
  float fStack_1c84;
  float fStack_1c80;
  float fStack_1c7c;
  float local_1c78;
  float fStack_1c74;
  float fStack_1c70;
  float fStack_1c6c;
  ulong uStack_1b30;
  float local_1ab8;
  float fStack_1ab4;
  float fStack_1ab0;
  float fStack_1aac;
  float fStack_1aa0;
  float fStack_1a9c;
  undefined8 local_1a68;
  undefined8 uStack_1a60;
  float local_1a08;
  float fStack_1a04;
  float local_19f8;
  float fStack_19f4;
  float fStack_19f0;
  float fStack_19ec;
  undefined8 local_1908;
  undefined8 uStack_1900;
  undefined8 local_18f8;
  undefined8 uStack_18f0;
  float local_15f8;
  float fStack_15f4;
  float fStack_15f0;
  float fStack_15ec;
  float local_15c8;
  float fStack_15c4;
  float fStack_15c0;
  float fStack_15bc;
  float local_15a8;
  float fStack_15a4;
  float fStack_15a0;
  float fStack_159c;
  undefined8 local_1518;
  undefined8 uStack_1510;
  undefined8 local_1508;
  undefined8 uStack_1500;
  float local_1208;
  float fStack_1204;
  float fStack_1200;
  float fStack_11fc;
  float local_11d8;
  float fStack_11d4;
  float fStack_11d0;
  float fStack_11cc;
  float local_11b8;
  float fStack_11b4;
  float fStack_11b0;
  float fStack_11ac;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float local_ed8;
  float fStack_ed4;
  float fStack_ed0;
  float fStack_ecc;
  float local_e48;
  float fStack_e44;
  float fStack_e40;
  float fStack_e3c;
  float local_e28;
  float fStack_e24;
  float fStack_e20;
  float fStack_e1c;
  undefined8 local_d08;
  undefined8 uStack_d00;
  undefined8 local_cf8;
  undefined8 uStack_cf0;
  float local_9f8;
  float fStack_9f4;
  float fStack_9f0;
  float fStack_9ec;
  float local_9c8;
  float fStack_9c4;
  float fStack_9c0;
  float fStack_9bc;
  float local_9a8;
  float fStack_9a4;
  float fStack_9a0;
  float fStack_99c;
  float local_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  undefined1 local_7b8 [8];
  float fStack_7b0;
  float fStack_7ac;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_738;
  undefined8 uStack_730;
  float local_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float local_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float local_6e8;
  float fStack_6e4;
  float fStack_6e0;
  float fStack_6dc;
  float local_6c8;
  float fStack_6c4;
  float fStack_6c0;
  float fStack_6bc;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  
  lVar71 = in_RSI[7];
  lVar5 = *in_RCX;
  for (local_2284 = 0; local_2284 < (int)lVar71; local_2284 = local_2284 + 1) {
    local_2290 = (undefined8 *)(*in_RSI + in_RSI[8] * (long)local_2284 * in_RSI[2]);
    iVar3 = *(int *)((long)in_RDI + 0x2c);
    lVar72 = in_RDI[6];
    lVar73 = in_RDI[7];
    iVar4 = *(int *)((long)in_RSI + 0x2c);
    lVar74 = in_RSI[6];
    for (local_2300 = 0; local_2300 < (int)lVar74; local_2300 = local_2300 + 1) {
      for (local_2304 = 0; local_2304 < iVar4; local_2304 = local_2304 + 1) {
        local_2318 = 0;
        uStack_2310 = 0;
        if (lVar5 != 0) {
          puVar77 = (undefined8 *)(lVar5 + (long)(local_2284 << 2) * 4);
          local_2318 = *puVar77;
          uStack_2310 = puVar77[1];
        }
        local_2320 = *in_RDX + in_RDX[8] * (long)local_2284 * in_RDX[2];
        for (local_236c = 0; local_236c < (int)lVar73; local_236c = local_236c + 1) {
          for (local_23bc = 0; local_23bc < in_R9D; local_23bc = local_23bc + 1) {
            iVar75 = (local_2300 + local_23bc * in_stack_00000010) -
                     in_stack_00000010 * (in_R9D + -1);
            if (((-1 < iVar75) && (iVar75 % in_stack_00000020 == 0)) &&
               (iVar75 / in_stack_00000020 < (int)lVar72)) {
              for (local_23c8 = 0; local_23c8 < in_R8D; local_23c8 = local_23c8 + 1) {
                iVar76 = (local_2304 + local_23c8 * in_stack_00000008) -
                         in_stack_00000008 * (in_R8D + -1);
                if (((-1 < iVar76) && (iVar76 % in_stack_00000018 == 0)) &&
                   (iVar76 / in_stack_00000018 < iVar3)) {
                  pfVar1 = (float *)(*in_RDI + in_RDI[8] * (long)local_236c * in_RDI[2] +
                                     (long)*(int *)((long)in_RDI + 0x2c) *
                                     (long)(iVar75 / in_stack_00000020) * in_RDI[2] +
                                    (long)(iVar76 / in_stack_00000018 << 2) * 4);
                  iVar76 = (local_23bc * in_R8D + local_23c8) * 0x10;
                  fVar79 = *pfVar1;
                  fVar80 = pfVar1[1];
                  fVar81 = pfVar1[2];
                  fVar82 = pfVar1[3];
                  puVar77 = (undefined8 *)(local_2320 + (long)iVar76 * 4);
                  uVar10 = *puVar77;
                  uVar11 = puVar77[1];
                  lVar78 = local_2320 + (long)iVar76 * 4;
                  uVar12 = *(undefined8 *)(lVar78 + 0x10);
                  uVar13 = *(undefined8 *)(lVar78 + 0x18);
                  lVar78 = local_2320 + (long)iVar76 * 4;
                  uVar14 = *(undefined8 *)(lVar78 + 0x20);
                  uVar15 = *(undefined8 *)(lVar78 + 0x28);
                  lVar78 = local_2320 + (long)iVar76 * 4;
                  uVar16 = *(undefined8 *)(lVar78 + 0x30);
                  uVar17 = *(undefined8 *)(lVar78 + 0x38);
                  local_1db8 = (float)uVar10;
                  fStack_1db4 = (float)((ulong)uVar10 >> 0x20);
                  fStack_1db0 = (float)uVar11;
                  fStack_1dac = (float)((ulong)uVar11 >> 0x20);
                  local_1ea8 = (float)local_2318;
                  fStack_1ea4 = (float)((ulong)local_2318 >> 0x20);
                  fStack_1ea0 = (float)uStack_2310;
                  fStack_1e9c = (float)((ulong)uStack_2310 >> 0x20);
                  local_1d98 = (float)uVar12;
                  fStack_1d94 = (float)((ulong)uVar12 >> 0x20);
                  fStack_1d90 = (float)uVar13;
                  fStack_1d8c = (float)((ulong)uVar13 >> 0x20);
                  local_1d78 = (float)uVar14;
                  fStack_1d74 = (float)((ulong)uVar14 >> 0x20);
                  fStack_1d70 = (float)uVar15;
                  fStack_1d6c = (float)((ulong)uVar15 >> 0x20);
                  local_1d58 = (float)uVar16;
                  fStack_1d54 = (float)((ulong)uVar16 >> 0x20);
                  fStack_1d50 = (float)uVar17;
                  fStack_1d4c = (float)((ulong)uVar17 >> 0x20);
                  local_2318 = CONCAT44(fVar82 * fStack_1d54 +
                                        fVar81 * fStack_1d74 +
                                        fVar80 * fStack_1d94 + fVar79 * fStack_1db4 + fStack_1ea4,
                                        fVar82 * local_1d58 +
                                        fVar81 * local_1d78 +
                                        fVar80 * local_1d98 + fVar79 * local_1db8 + local_1ea8);
                  uStack_2310 = CONCAT44(fVar82 * fStack_1d4c +
                                         fVar81 * fStack_1d6c +
                                         fVar80 * fStack_1d8c + fVar79 * fStack_1dac + fStack_1e9c,
                                         fVar82 * fStack_1d50 +
                                         fVar81 * fStack_1d70 +
                                         fVar80 * fStack_1d90 + fVar79 * fStack_1db0 + fStack_1ea0);
                }
              }
            }
          }
          local_2320 = local_2320 + (long)(in_R8D * in_R9D * 0x10) * 4;
        }
        fStack_1aa0 = (float)uStack_2310;
        fStack_1a9c = (float)((ulong)uStack_2310 >> 0x20);
        local_1a08 = (float)local_2318;
        fStack_1a04 = (float)((ulong)local_2318 >> 0x20);
        switch(in_stack_00000028) {
        case 1:
          uStack_1e10 = SUB168(ZEXT816(0),4);
          auVar18._8_8_ = uStack_2310;
          auVar18._0_8_ = local_2318;
          auVar69._8_8_ = 0;
          auVar69._0_8_ = uStack_1e10;
          _local_1e28 = vmaxps_avx(auVar18,auVar69 << 0x40);
          break;
        case 2:
          fVar79 = *(float *)*in_stack_00000030;
          auVar21._8_8_ = uStack_2310;
          auVar21._0_8_ = local_2318;
          auVar8 = vmaxps_avx(ZEXT816(0),auVar21);
          auVar22._8_8_ = uStack_2310;
          auVar22._0_8_ = local_2318;
          auVar6 = vminps_avx(ZEXT816(0),auVar22);
          local_1c78 = auVar6._0_4_;
          fStack_1c74 = auVar6._4_4_;
          fStack_1c70 = auVar6._8_4_;
          fStack_1c6c = auVar6._12_4_;
          local_1c88 = auVar8._0_4_;
          fStack_1c84 = auVar8._4_4_;
          fStack_1c80 = auVar8._8_4_;
          fStack_1c7c = auVar8._12_4_;
          local_1e28._4_4_ = fStack_1c84 + fVar79 * fStack_1c74;
          local_1e28._0_4_ = local_1c88 + fVar79 * local_1c78;
          uStack_1e20._0_4_ = fStack_1c80 + fVar79 * fStack_1c70;
          uStack_1e20._4_4_ = fStack_1c7c + fVar79 * fStack_1c6c;
          break;
        case 3:
          uVar2 = *(undefined4 *)*in_stack_00000030;
          auVar19._4_4_ = uVar2;
          auVar19._0_4_ = uVar2;
          auVar19._12_4_ = uVar2;
          auVar19._8_4_ = uVar2;
          uVar2 = *(undefined4 *)(*in_stack_00000030 + 4);
          auVar23._4_4_ = uVar2;
          auVar23._0_4_ = uVar2;
          auVar23._12_4_ = uVar2;
          auVar23._8_4_ = uVar2;
          auVar20._8_8_ = uStack_2310;
          auVar20._0_8_ = local_2318;
          auVar8 = vmaxps_avx(auVar20,auVar19);
          _local_1e28 = vminps_avx(auVar8,auVar23);
          break;
        case 4:
          auVar24._8_8_ = 0x3f8000003f800000;
          auVar24._0_8_ = 0x3f8000003f800000;
          uStack_1b30 = SUB168(ZEXT816(0),4);
          auVar70._8_8_ = 0;
          auVar70._0_8_ = uStack_1b30;
          auVar33._8_8_ = uStack_2310;
          auVar33._0_8_ = local_2318;
          auVar8 = vsubps_avx(auVar70 << 0x40,auVar33);
          auVar32._8_8_ = 0x42b0c0a542b0c0a5;
          auVar32._0_8_ = 0x42b0c0a542b0c0a5;
          auVar8 = vminps_avx(auVar8,auVar32);
          auVar31._8_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar31._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar7 = vmaxps_avx(auVar8,auVar31);
          local_11b8 = auVar7._0_4_;
          fStack_11b4 = auVar7._4_4_;
          fStack_11b0 = auVar7._8_4_;
          fStack_11ac = auVar7._12_4_;
          fVar79 = local_11b8 * 1.442695 + 0.5;
          fVar80 = fStack_11b4 * 1.442695 + 0.5;
          fVar81 = fStack_11b0 * 1.442695 + 0.5;
          fVar82 = fStack_11ac * 1.442695 + 0.5;
          local_1508 = CONCAT44(fVar80,fVar79);
          uStack_1500._0_4_ = fVar81;
          uStack_1500._4_4_ = fVar82;
          local_1518 = CONCAT44((int)fVar80,(int)fVar79);
          uStack_1510._0_4_ = (int)fVar81;
          uStack_1510._4_4_ = (int)fVar82;
          auVar34._8_8_ = uStack_1510;
          auVar34._0_8_ = local_1518;
          auVar6 = vcvtdq2ps_avx(auVar34);
          auVar36._8_8_ = uStack_1500;
          auVar36._0_8_ = local_1508;
          auVar8 = vcmpps_avx(auVar36,auVar6,1);
          auVar38._8_8_ = 0x3f8000003f800000;
          auVar38._0_8_ = 0x3f8000003f800000;
          auVar8 = vpand_avx(auVar8,auVar38);
          auVar8 = vsubps_avx(auVar6,auVar8);
          local_f98 = auVar8._0_4_;
          fStack_f94 = auVar8._4_4_;
          fStack_f90 = auVar8._8_4_;
          fStack_f8c = auVar8._12_4_;
          auVar41._4_4_ = fStack_f94 * 0.6933594;
          auVar41._0_4_ = local_f98 * 0.6933594;
          auVar41._8_4_ = fStack_f90 * 0.6933594;
          auVar41._12_4_ = fStack_f8c * 0.6933594;
          auVar8 = vsubps_avx(auVar7,auVar41);
          auVar40._4_4_ = fStack_f94 * -0.00021219444;
          auVar40._0_4_ = local_f98 * -0.00021219444;
          auVar40._8_4_ = fStack_f90 * -0.00021219444;
          auVar40._12_4_ = fStack_f8c * -0.00021219444;
          auVar8 = vsubps_avx(auVar8,auVar40);
          local_11d8 = auVar8._0_4_;
          fStack_11d4 = auVar8._4_4_;
          fStack_11d0 = auVar8._8_4_;
          fStack_11cc = auVar8._12_4_;
          local_1518 = CONCAT44((int)fStack_f94,(int)local_f98);
          uStack_1510._0_4_ = (int)fStack_f90;
          uStack_1510._4_4_ = (int)fStack_f8c;
          auVar30._8_8_ = uStack_1510;
          auVar30._0_8_ = local_1518;
          auVar29._8_8_ = 0x7f0000007f;
          auVar29._0_8_ = 0x7f0000007f;
          auVar8 = vpaddd_avx(auVar30,auVar29);
          auVar8 = vpslld_avx(auVar8,ZEXT416(0x17));
          local_1208 = auVar8._0_4_;
          fStack_1204 = auVar8._4_4_;
          fStack_1200 = auVar8._8_4_;
          fStack_11fc = auVar8._12_4_;
          auVar25._4_4_ =
               ((((((fStack_11d4 * 0.00019875691 + 0.0013981999) * fStack_11d4 + 0.008333452) *
                   fStack_11d4 + 0.041665796) * fStack_11d4 + 0.16666666) * fStack_11d4 + 0.5) *
                fStack_11d4 * fStack_11d4 + fStack_11d4 + 1.0) * fStack_1204 + 1.0;
          auVar25._0_4_ =
               ((((((local_11d8 * 0.00019875691 + 0.0013981999) * local_11d8 + 0.008333452) *
                   local_11d8 + 0.041665796) * local_11d8 + 0.16666666) * local_11d8 + 0.5) *
                local_11d8 * local_11d8 + local_11d8 + 1.0) * local_1208 + 1.0;
          auVar25._8_4_ =
               ((((((fStack_11d0 * 0.00019875691 + 0.0013981999) * fStack_11d0 + 0.008333452) *
                   fStack_11d0 + 0.041665796) * fStack_11d0 + 0.16666666) * fStack_11d0 + 0.5) *
                fStack_11d0 * fStack_11d0 + fStack_11d0 + 1.0) * fStack_1200 + 1.0;
          auVar25._12_4_ =
               ((((((fStack_11cc * 0.00019875691 + 0.0013981999) * fStack_11cc + 0.008333452) *
                   fStack_11cc + 0.041665796) * fStack_11cc + 0.16666666) * fStack_11cc + 0.5) *
                fStack_11cc * fStack_11cc + fStack_11cc + 1.0) * fStack_11fc + 1.0;
          _local_1e28 = vdivps_avx(auVar24,auVar25);
          break;
        case 5:
          auVar28._8_8_ = uStack_2310;
          auVar28._0_8_ = local_2318;
          auVar27._8_8_ = 0x42b0c0a542b0c0a5;
          auVar27._0_8_ = 0x42b0c0a542b0c0a5;
          auVar8 = vminps_avx(auVar28,auVar27);
          auVar26._8_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar26._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar7 = vmaxps_avx(auVar8,auVar26);
          local_15a8 = auVar7._0_4_;
          fStack_15a4 = auVar7._4_4_;
          fStack_15a0 = auVar7._8_4_;
          fStack_159c = auVar7._12_4_;
          fVar79 = local_15a8 * 1.442695 + 0.5;
          fVar80 = fStack_15a4 * 1.442695 + 0.5;
          fVar81 = fStack_15a0 * 1.442695 + 0.5;
          fVar82 = fStack_159c * 1.442695 + 0.5;
          local_18f8 = CONCAT44(fVar80,fVar79);
          uStack_18f0._0_4_ = fVar81;
          uStack_18f0._4_4_ = fVar82;
          local_1908 = CONCAT44((int)fVar80,(int)fVar79);
          uStack_1900._0_4_ = (int)fVar81;
          uStack_1900._4_4_ = (int)fVar82;
          auVar35._8_8_ = uStack_1900;
          auVar35._0_8_ = local_1908;
          auVar6 = vcvtdq2ps_avx(auVar35);
          auVar37._8_8_ = uStack_18f0;
          auVar37._0_8_ = local_18f8;
          auVar8 = vcmpps_avx(auVar37,auVar6,1);
          auVar39._8_8_ = 0x3f8000003f800000;
          auVar39._0_8_ = 0x3f8000003f800000;
          auVar8 = vpand_avx(auVar8,auVar39);
          auVar8 = vsubps_avx(auVar6,auVar8);
          local_ed8 = auVar8._0_4_;
          fStack_ed4 = auVar8._4_4_;
          fStack_ed0 = auVar8._8_4_;
          fStack_ecc = auVar8._12_4_;
          auVar43._4_4_ = fStack_ed4 * 0.6933594;
          auVar43._0_4_ = local_ed8 * 0.6933594;
          auVar43._8_4_ = fStack_ed0 * 0.6933594;
          auVar43._12_4_ = fStack_ecc * 0.6933594;
          auVar8 = vsubps_avx(auVar7,auVar43);
          auVar42._4_4_ = fStack_ed4 * -0.00021219444;
          auVar42._0_4_ = local_ed8 * -0.00021219444;
          auVar42._8_4_ = fStack_ed0 * -0.00021219444;
          auVar42._12_4_ = fStack_ecc * -0.00021219444;
          auVar8 = vsubps_avx(auVar8,auVar42);
          local_15c8 = auVar8._0_4_;
          fStack_15c4 = auVar8._4_4_;
          fStack_15c0 = auVar8._8_4_;
          fStack_15bc = auVar8._12_4_;
          local_1908 = CONCAT44((int)fStack_ed4,(int)local_ed8);
          uStack_1900._0_4_ = (int)fStack_ed0;
          uStack_1900._4_4_ = (int)fStack_ecc;
          auVar9._8_8_ = uStack_1900;
          auVar9._0_8_ = local_1908;
          auVar7._8_8_ = 0x7f0000007f;
          auVar7._0_8_ = 0x7f0000007f;
          auVar8 = vpaddd_avx(auVar9,auVar7);
          auVar8 = vpslld_avx(auVar8,ZEXT416(0x17));
          local_15f8 = auVar8._0_4_;
          fStack_15f4 = auVar8._4_4_;
          fStack_15f0 = auVar8._8_4_;
          fStack_15ec = auVar8._12_4_;
          local_738 = CONCAT44(((((((fStack_15c4 * 0.00019875691 + 0.0013981999) * fStack_15c4 +
                                   0.008333452) * fStack_15c4 + 0.041665796) * fStack_15c4 +
                                 0.16666666) * fStack_15c4 + 0.5) * fStack_15c4 * fStack_15c4 +
                                fStack_15c4 + 1.0) * fStack_15f4 + 1.0,
                               ((((((local_15c8 * 0.00019875691 + 0.0013981999) * local_15c8 +
                                   0.008333452) * local_15c8 + 0.041665796) * local_15c8 +
                                 0.16666666) * local_15c8 + 0.5) * local_15c8 * local_15c8 +
                                local_15c8 + 1.0) * local_15f8 + 1.0);
          uStack_730._0_4_ =
               ((((((fStack_15c0 * 0.00019875691 + 0.0013981999) * fStack_15c0 + 0.008333452) *
                   fStack_15c0 + 0.041665796) * fStack_15c0 + 0.16666666) * fStack_15c0 + 0.5) *
                fStack_15c0 * fStack_15c0 + fStack_15c0 + 1.0) * fStack_15f0 + 1.0;
          uStack_730._4_4_ =
               ((((((fStack_15bc * 0.00019875691 + 0.0013981999) * fStack_15bc + 0.008333452) *
                   fStack_15bc + 0.041665796) * fStack_15bc + 0.16666666) * fStack_15bc + 0.5) *
                fStack_15bc * fStack_15bc + fStack_15bc + 1.0) * fStack_15ec + 1.0;
          auVar65._8_8_ = uStack_730;
          auVar65._0_8_ = local_738;
          auVar8 = vcmpps_avx(auVar65,ZEXT816(0),2);
          auVar59._8_8_ = uStack_730;
          auVar59._0_8_ = local_738;
          auVar58._8_8_ = 0x80000000800000;
          auVar58._0_8_ = 0x80000000800000;
          auVar6 = vmaxps_avx(auVar59,auVar58);
          auVar7 = vpsrld_avx(auVar6,ZEXT416(0x17));
          auVar63._8_8_ = 0x807fffff807fffff;
          auVar63._0_8_ = 0x807fffff807fffff;
          auVar6 = vpand_avx(auVar6,auVar63);
          auVar67._8_8_ = 0x3f0000003f000000;
          auVar67._0_8_ = 0x3f0000003f000000;
          auVar9 = vpor_avx(auVar6,auVar67);
          auVar57._8_8_ = 0x7f0000007f;
          auVar57._0_8_ = 0x7f0000007f;
          auVar6 = vpsubd_avx(auVar7,auVar57);
          auVar6 = vcvtdq2ps_avx(auVar6);
          local_6c8 = auVar6._0_4_;
          fStack_6c4 = auVar6._4_4_;
          fStack_6c0 = auVar6._8_4_;
          fStack_6bc = auVar6._12_4_;
          local_778 = CONCAT44(fStack_6c4 + 1.0,local_6c8 + 1.0);
          uStack_770._0_4_ = fStack_6c0 + 1.0;
          uStack_770._4_4_ = fStack_6bc + 1.0;
          auVar68._8_8_ = 0x3f3504f33f3504f3;
          auVar68._0_8_ = 0x3f3504f33f3504f3;
          auVar6 = vcmpps_avx(auVar9,auVar68,1);
          auVar7 = vpand_avx(auVar9,auVar6);
          auVar61._8_8_ = 0x3f8000003f800000;
          auVar61._0_8_ = 0x3f8000003f800000;
          auVar9 = vsubps_avx(auVar9,auVar61);
          auVar62._8_8_ = 0x3f8000003f800000;
          auVar62._0_8_ = 0x3f8000003f800000;
          auVar6 = vpand_avx(auVar6,auVar62);
          auVar60._8_8_ = uStack_770;
          auVar60._0_8_ = local_778;
          auVar6 = vsubps_avx(auVar60,auVar6);
          local_6e8 = auVar9._0_4_;
          fStack_6e4 = auVar9._4_4_;
          fStack_6e0 = auVar9._8_4_;
          fStack_6dc = auVar9._12_4_;
          local_6f8 = auVar7._0_4_;
          fStack_6f4 = auVar7._4_4_;
          fStack_6f0 = auVar7._8_4_;
          fStack_6ec = auVar7._12_4_;
          local_6e8 = local_6e8 + local_6f8;
          fStack_6e4 = fStack_6e4 + fStack_6f4;
          fStack_6e0 = fStack_6e0 + fStack_6f0;
          fStack_6dc = fStack_6dc + fStack_6ec;
          local_2e8 = auVar6._0_4_;
          fStack_2e4 = auVar6._4_4_;
          fStack_2e0 = auVar6._8_4_;
          fStack_2dc = auVar6._12_4_;
          local_7b8._4_4_ =
               fStack_2e4 * -0.00021219444 +
               ((((((((fStack_6e4 * 0.070376836 + -0.1151461) * fStack_6e4 + 0.116769984) *
                     fStack_6e4 + -0.12420141) * fStack_6e4 + 0.14249323) * fStack_6e4 + -0.16668057
                  ) * fStack_6e4 + 0.20000714) * fStack_6e4 + -0.24999994) * fStack_6e4 + 0.3333333)
               * fStack_6e4 * fStack_6e4 * fStack_6e4;
          local_7b8._0_4_ =
               local_2e8 * -0.00021219444 +
               ((((((((local_6e8 * 0.070376836 + -0.1151461) * local_6e8 + 0.116769984) * local_6e8
                    + -0.12420141) * local_6e8 + 0.14249323) * local_6e8 + -0.16668057) * local_6e8
                 + 0.20000714) * local_6e8 + -0.24999994) * local_6e8 + 0.3333333) * local_6e8 *
               local_6e8 * local_6e8;
          fStack_7b0 = fStack_2e0 * -0.00021219444 +
                       ((((((((fStack_6e0 * 0.070376836 + -0.1151461) * fStack_6e0 + 0.116769984) *
                             fStack_6e0 + -0.12420141) * fStack_6e0 + 0.14249323) * fStack_6e0 +
                          -0.16668057) * fStack_6e0 + 0.20000714) * fStack_6e0 + -0.24999994) *
                        fStack_6e0 + 0.3333333) * fStack_6e0 * fStack_6e0 * fStack_6e0;
          fStack_7ac = fStack_2dc * -0.00021219444 +
                       ((((((((fStack_6dc * 0.070376836 + -0.1151461) * fStack_6dc + 0.116769984) *
                             fStack_6dc + -0.12420141) * fStack_6dc + 0.14249323) * fStack_6dc +
                          -0.16668057) * fStack_6dc + 0.20000714) * fStack_6dc + -0.24999994) *
                        fStack_6dc + 0.3333333) * fStack_6dc * fStack_6dc * fStack_6dc;
          auVar64._4_4_ = fStack_6e4 * fStack_6e4 * 0.5;
          auVar64._0_4_ = local_6e8 * local_6e8 * 0.5;
          auVar64._8_4_ = fStack_6e0 * fStack_6e0 * 0.5;
          auVar64._12_4_ = fStack_6dc * fStack_6dc * 0.5;
          auVar6 = vsubps_avx(_local_7b8,auVar64);
          local_718 = auVar6._0_4_;
          fStack_714 = auVar6._4_4_;
          fStack_710 = auVar6._8_4_;
          fStack_70c = auVar6._12_4_;
          local_738 = CONCAT44(fStack_2e4 * 0.6933594 + fStack_6e4 + fStack_714,
                               local_2e8 * 0.6933594 + local_6e8 + local_718);
          uStack_730._0_4_ = fStack_2e0 * 0.6933594 + fStack_6e0 + fStack_710;
          uStack_730._4_4_ = fStack_2dc * 0.6933594 + fStack_6dc + fStack_70c;
          auVar66._8_8_ = uStack_730;
          auVar66._0_8_ = local_738;
          auVar8 = vpor_avx(auVar66,auVar8);
          local_e28 = auVar8._0_4_;
          fStack_e24 = auVar8._4_4_;
          fStack_e20 = auVar8._8_4_;
          fStack_e1c = auVar8._12_4_;
          auVar50._4_4_ = fStack_e24 * 2.0;
          auVar50._0_4_ = local_e28 * 2.0;
          auVar50._12_4_ = fStack_e1c * 2.0;
          auVar50._8_4_ = fStack_e20 * 2.0;
          auVar8 = vsubps_avx(ZEXT816(0),auVar50);
          auVar49._8_8_ = 0x42b0c0a542b0c0a5;
          auVar49._0_8_ = 0x42b0c0a542b0c0a5;
          auVar8 = vminps_avx(auVar8,auVar49);
          auVar48._8_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar48._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar7 = vmaxps_avx(auVar48,auVar8);
          local_9a8 = auVar7._0_4_;
          fStack_9a4 = auVar7._4_4_;
          fStack_9a0 = auVar7._8_4_;
          fStack_99c = auVar7._12_4_;
          fVar79 = local_9a8 * 1.442695 + 0.5;
          fVar80 = fStack_9a4 * 1.442695 + 0.5;
          fVar81 = fStack_9a0 * 1.442695 + 0.5;
          fVar82 = fStack_99c * 1.442695 + 0.5;
          local_cf8 = CONCAT44(fVar80,fVar79);
          uStack_cf0._0_4_ = fVar81;
          uStack_cf0._4_4_ = fVar82;
          local_d08 = CONCAT44((int)fVar80,(int)fVar79);
          uStack_d00._0_4_ = (int)fVar81;
          uStack_d00._4_4_ = (int)fVar82;
          auVar52._8_8_ = uStack_d00;
          auVar52._0_8_ = local_d08;
          auVar6 = vcvtdq2ps_avx(auVar52);
          auVar53._8_8_ = uStack_cf0;
          auVar53._0_8_ = local_cf8;
          auVar8 = vcmpps_avx(auVar53,auVar6,1);
          auVar54._8_8_ = 0x3f8000003f800000;
          auVar54._0_8_ = 0x3f8000003f800000;
          auVar8 = vpand_avx(auVar8,auVar54);
          auVar8 = vsubps_avx(auVar6,auVar8);
          local_7f8 = auVar8._0_4_;
          fStack_7f4 = auVar8._4_4_;
          fStack_7f0 = auVar8._8_4_;
          fStack_7ec = auVar8._12_4_;
          auVar56._4_4_ = fStack_7f4 * 0.6933594;
          auVar56._0_4_ = local_7f8 * 0.6933594;
          auVar56._8_4_ = fStack_7f0 * 0.6933594;
          auVar56._12_4_ = fStack_7ec * 0.6933594;
          auVar8 = vsubps_avx(auVar7,auVar56);
          auVar55._4_4_ = fStack_7f4 * -0.00021219444;
          auVar55._0_4_ = local_7f8 * -0.00021219444;
          auVar55._8_4_ = fStack_7f0 * -0.00021219444;
          auVar55._12_4_ = fStack_7ec * -0.00021219444;
          auVar8 = vsubps_avx(auVar8,auVar55);
          local_9c8 = auVar8._0_4_;
          fStack_9c4 = auVar8._4_4_;
          fStack_9c0 = auVar8._8_4_;
          fStack_9bc = auVar8._12_4_;
          local_d08 = CONCAT44((int)fStack_7f4,(int)local_7f8);
          uStack_d00._0_4_ = (int)fStack_7f0;
          uStack_d00._4_4_ = (int)fStack_7ec;
          auVar47._8_8_ = uStack_d00;
          auVar47._0_8_ = local_d08;
          auVar46._8_8_ = 0x7f0000007f;
          auVar46._0_8_ = 0x7f0000007f;
          auVar8 = vpaddd_avx(auVar47,auVar46);
          auVar8 = vpslld_avx(auVar8,ZEXT416(0x17));
          local_9f8 = auVar8._0_4_;
          fStack_9f4 = auVar8._4_4_;
          fStack_9f0 = auVar8._8_4_;
          fStack_9ec = auVar8._12_4_;
          auVar45._8_8_ = 0x3f8000003f800000;
          auVar45._0_8_ = 0x3f8000003f800000;
          auVar44._4_4_ =
               ((((((fStack_9c4 * 0.00019875691 + 0.0013981999) * fStack_9c4 + 0.008333452) *
                   fStack_9c4 + 0.041665796) * fStack_9c4 + 0.16666666) * fStack_9c4 + 0.5) *
                fStack_9c4 * fStack_9c4 + fStack_9c4 + 1.0) * fStack_9f4 + 1.0;
          auVar44._0_4_ =
               ((((((local_9c8 * 0.00019875691 + 0.0013981999) * local_9c8 + 0.008333452) *
                   local_9c8 + 0.041665796) * local_9c8 + 0.16666666) * local_9c8 + 0.5) *
                local_9c8 * local_9c8 + local_9c8 + 1.0) * local_9f8 + 1.0;
          auVar44._8_4_ =
               ((((((fStack_9c0 * 0.00019875691 + 0.0013981999) * fStack_9c0 + 0.008333452) *
                   fStack_9c0 + 0.041665796) * fStack_9c0 + 0.16666666) * fStack_9c0 + 0.5) *
                fStack_9c0 * fStack_9c0 + fStack_9c0 + 1.0) * fStack_9f0 + 1.0;
          auVar44._12_4_ =
               ((((((fStack_9bc * 0.00019875691 + 0.0013981999) * fStack_9bc + 0.008333452) *
                   fStack_9bc + 0.041665796) * fStack_9bc + 0.16666666) * fStack_9bc + 0.5) *
                fStack_9bc * fStack_9bc + fStack_9bc + 1.0) * fStack_9ec + 1.0;
          auVar8 = vdivps_avx(auVar45,auVar44);
          local_e48 = auVar8._0_4_;
          fStack_e44 = auVar8._4_4_;
          fStack_e40 = auVar8._8_4_;
          fStack_e3c = auVar8._12_4_;
          auVar83._0_4_ = local_e48 * 2.0;
          auVar83._4_4_ = fStack_e44 * 2.0;
          auVar83._8_4_ = fStack_e40 * 2.0;
          auVar83._12_4_ = fStack_e3c * 2.0;
          auVar51._8_8_ = 0x3f8000003f800000;
          auVar51._0_8_ = 0x3f8000003f800000;
          auVar8 = vsubps_avx(auVar83,auVar51);
          local_1ab8 = auVar8._0_4_;
          fStack_1ab4 = auVar8._4_4_;
          fStack_1ab0 = auVar8._8_4_;
          fStack_1aac = auVar8._12_4_;
          local_1e28._4_4_ = fStack_1a04 * fStack_1ab4;
          local_1e28._0_4_ = local_1a08 * local_1ab8;
          uStack_1e20._0_4_ = fStack_1aa0 * fStack_1ab0;
          uStack_1e20._4_4_ = fStack_1a9c * fStack_1aac;
          break;
        case 6:
          fVar79 = *(float *)*in_stack_00000030;
          fVar80 = *(float *)(*in_stack_00000030 + 4);
          local_1a68 = CONCAT44(fStack_1a04 * fVar79 + fVar80,local_1a08 * fVar79 + fVar80);
          uStack_1a60._0_4_ = fStack_1aa0 * fVar79 + fVar80;
          uStack_1a60._4_4_ = fStack_1a9c * fVar79 + fVar80;
          auVar8._8_8_ = uStack_1a60;
          auVar8._0_8_ = local_1a68;
          auVar8 = vmaxps_avx(auVar8,ZEXT816(0));
          auVar6._8_8_ = 0x3f8000003f800000;
          auVar6._0_8_ = 0x3f8000003f800000;
          auVar8 = vminps_avx(auVar8,auVar6);
          local_19f8 = auVar8._0_4_;
          fStack_19f4 = auVar8._4_4_;
          fStack_19f0 = auVar8._8_4_;
          fStack_19ec = auVar8._12_4_;
          local_1e28._4_4_ = fStack_19f4 * fStack_1a04;
          local_1e28._0_4_ = local_19f8 * local_1a08;
          uStack_1e20._0_4_ = fStack_19f0 * fStack_1aa0;
          uStack_1e20._4_4_ = fStack_19ec * fStack_1a9c;
          break;
        default:
          uStack_1e20 = uStack_2310;
          local_1e28 = (undefined1  [8])local_2318;
        }
        *local_2290 = local_1e28;
        local_2290[1] = uStack_1e20;
        local_2290 = local_2290 + 2;
      }
    }
  }
  return;
}

Assistant:

static void deconvolution_pack4_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data_packed, const Mat& bias_data, int kernel_w, int kernel_h, int dilation_w, int dilation_h, int stride_w, int stride_h, int activation_type, const Mat& activation_params, const Option& opt)
{
    int outch = top_blob.c;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    const float* bias_data_ptr = bias_data;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* outptr = top_blob.channel(p);

        const int maxk = kernel_w * kernel_h;

        // shadowed variable for less openmp task args
        const int w = bottom_blob.w;
        const int h = bottom_blob.h;
        const int channels = bottom_blob.c;
        const int outw = top_blob.w;
        const int outh = top_blob.h;

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                __m128 _sum = _mm_setzero_ps();

                if (bias_data_ptr)
                {
                    _sum = _mm_loadu_ps(bias_data_ptr + p * 4);
                }

                const float* kptr = weight_data_packed.channel(p);

                // channels
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob.channel(q);

                    for (int y = 0; y < kernel_h; y++)
                    {
                        int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                        if (sys < 0 || sys % stride_h != 0)
                            continue;

                        int sy = sys / stride_h;
                        if (sy >= h)
                            continue;

                        for (int x = 0; x < kernel_w; x++)
                        {
                            int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                            if (sxs < 0 || sxs % stride_w != 0)
                                continue;

                            int sx = sxs / stride_w;
                            if (sx >= w)
                                continue;

                            const float* sptr = m.row(sy) + sx * 4;

                            int k = (y * kernel_w + x) * 16;

                            __m128 _val0 = _mm_load1_ps(sptr);
                            __m128 _val1 = _mm_load1_ps(sptr + 1);
                            __m128 _val2 = _mm_load1_ps(sptr + 2);
                            __m128 _val3 = _mm_load1_ps(sptr + 3);
                            __m128 _w0 = _mm_load_ps(kptr + k);
                            __m128 _w1 = _mm_load_ps(kptr + k + 4);
                            __m128 _w2 = _mm_load_ps(kptr + k + 8);
                            __m128 _w3 = _mm_load_ps(kptr + k + 12);
                            _sum = _mm_comp_fmadd_ps(_val0, _w0, _sum);
                            _sum = _mm_comp_fmadd_ps(_val1, _w1, _sum);
                            _sum = _mm_comp_fmadd_ps(_val2, _w2, _sum);
                            _sum = _mm_comp_fmadd_ps(_val3, _w3, _sum);
                        }
                    }

                    kptr += maxk * 16;
                }

                _sum = activation_sse(_sum, activation_type, activation_params);

                _mm_storeu_ps(outptr, _sum);
                outptr += 4;
            }
        }
    }
}